

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlNode * __thiscall
despot::util::tinyxml::TiXmlNode::InsertAfterChild
          (TiXmlNode *this,TiXmlNode *afterThis,TiXmlNode *addThis)

{
  int iVar1;
  TiXmlDocument *pTVar2;
  undefined4 extraout_var;
  TiXmlNode *node;
  TiXmlNode *addThis_local;
  TiXmlNode *afterThis_local;
  TiXmlNode *this_local;
  
  if ((afterThis == (TiXmlNode *)0x0) || (afterThis->parent != this)) {
    this_local = (TiXmlNode *)0x0;
  }
  else {
    iVar1 = Type(addThis);
    if (iVar1 == 0) {
      pTVar2 = GetDocument(this);
      if (pTVar2 != (TiXmlDocument *)0x0) {
        pTVar2 = GetDocument(this);
        TiXmlDocument::SetError
                  (pTVar2,0x10,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
      }
      this_local = (TiXmlNode *)0x0;
    }
    else {
      iVar1 = (*(addThis->super_TiXmlBase)._vptr_TiXmlBase[0x10])();
      this_local = (TiXmlNode *)CONCAT44(extraout_var,iVar1);
      if (this_local == (TiXmlNode *)0x0) {
        this_local = (TiXmlNode *)0x0;
      }
      else {
        this_local->parent = this;
        this_local->prev = afterThis;
        this_local->next = afterThis->next;
        if (afterThis->next == (TiXmlNode *)0x0) {
          if (this->lastChild != afterThis) {
            __assert_fail("lastChild == afterThis",
                          "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                          ,0xf8,
                          "TiXmlNode *despot::util::tinyxml::TiXmlNode::InsertAfterChild(TiXmlNode *, const TiXmlNode &)"
                         );
          }
          this->lastChild = this_local;
        }
        else {
          afterThis->next->prev = this_local;
        }
        afterThis->next = this_local;
      }
    }
  }
  return this_local;
}

Assistant:

TiXmlNode* TiXmlNode::InsertAfterChild(TiXmlNode* afterThis,
	const TiXmlNode& addThis) {
	if (!afterThis || afterThis->parent != this) {
		return 0;
	}
	if (addThis.Type() == TiXmlNode::DOCUMENT) {
		if (GetDocument())
			GetDocument()->SetError(TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0,
				TIXML_ENCODING_UNKNOWN);
		return 0;
	}

	TiXmlNode* node = addThis.Clone();
	if (!node)
		return 0;
	node->parent = this;

	node->prev = afterThis;
	node->next = afterThis->next;
	if (afterThis->next) {
		afterThis->next->prev = node;
	} else {
		assert(lastChild == afterThis);
		lastChild = node;
	}
	afterThis->next = node;
	return node;
}